

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randname.c
# Opt level: O3

size_t randname_make(randname_type name_type,size_t min,size_t max,char *word_buf,size_t buflen,
                    char ***sections)

{
  unsigned_short *puVar1;
  ushort uVar2;
  int iVar3;
  undefined4 uVar4;
  char **ppcVar5;
  __int32_t *p_Var6;
  randname_type rVar7;
  _Bool _Var8;
  uint32_t uVar9;
  uint uVar10;
  __int32_t **pp_Var11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  long lVar21;
  int iVar22;
  char *pcVar23;
  byte bVar24;
  long lVar25;
  byte *pbVar26;
  int local_58;
  
  if (1 < name_type - RANDNAME_TOLKIEN) {
    __assert_fail("name_type > 0 && name_type < RANDNAME_NUM_TYPES",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/randname.c"
                  ,0x56,
                  "size_t randname_make(randname_type, size_t, size_t, char *, size_t, const char ***)"
                 );
  }
  if (buflen <= max) {
    __assert_fail("buflen > max",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/randname.c"
                  ,0x59,
                  "size_t randname_make(randname_type, size_t, size_t, char *, size_t, const char ***)"
                 );
  }
  rVar7 = randname_make::cached_type;
  if (randname_make::cached_type != name_type) {
    ppcVar5 = sections[name_type];
    memset(randname_make::lprobs,0,0x9f78);
    pbVar26 = (byte *)*ppcVar5;
    rVar7 = name_type;
    if (pbVar26 != (byte *)0x0) {
      lVar25 = 0;
      do {
        bVar24 = *pbVar26;
        if (bVar24 == 0) {
          lVar15 = 0x1a;
          lVar21 = 0x1a;
        }
        else {
          pp_Var11 = __ctype_tolower_loc();
          p_Var6 = *pp_Var11;
          iVar22 = 0x1a;
          iVar17 = 0x1a;
          do {
            pbVar26 = pbVar26 + 1;
            iVar3 = p_Var6[bVar24];
            lVar21 = (long)iVar17;
            puVar1 = randname_make::lprobs[(long)iVar22 + -1][lVar21 + 0x17] + (long)iVar3 + 0xf;
            *puVar1 = *puVar1 + 1;
            lVar15 = (long)iVar3 + -0x61;
            puVar1 = randname_make::lprobs[iVar22][lVar21] + 0x1b;
            *puVar1 = *puVar1 + 1;
            bVar24 = *pbVar26;
            iVar22 = iVar17;
            iVar17 = (int)lVar15;
          } while (bVar24 != 0);
        }
        uVar4 = *(undefined4 *)(randname_make::lprobs[lVar21][lVar15] + 0x1a);
        *(uint *)(randname_make::lprobs[lVar21][lVar15] + 0x1a) =
             CONCAT22((short)((uint)uVar4 >> 0x10) + 1,(short)uVar4 + 1);
        pbVar26 = (byte *)ppcVar5[lVar25 + 1];
        lVar25 = lVar25 + 1;
        rVar7 = name_type;
      } while (pbVar26 != (byte *)0x0);
    }
  }
  do {
    randname_make::cached_type = rVar7;
    local_58 = 0;
    bVar24 = 0;
    uVar20 = 0x1a;
    uVar10 = 0x1a;
    uVar13 = 0;
    pcVar23 = word_buf;
    do {
      if (0x1a < uVar20) {
        __assert_fail("c_cur >= 0 && c_cur <= S_WORD",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/randname.c"
                      ,0x7c,
                      "size_t randname_make(randname_type, size_t, size_t, char *, size_t, const char ***)"
                     );
      }
      uVar12 = (ulong)uVar10;
      uVar16 = (ulong)uVar20;
      uVar9 = Rand_div((uint)randname_make::lprobs[uVar12][uVar16][0x1b]);
      uVar2 = randname_make::lprobs[uVar12][uVar16][0];
      uVar14 = (uint)uVar2;
      uVar19 = 0;
      if ((int)uVar9 < (int)(uint)uVar2) {
LAB_001caca4:
        uVar10 = (uint)uVar19 + 0x61;
        *pcVar23 = (char)uVar10;
        _Var8 = is_a_vowel(uVar10 & 0xff);
        bVar24 = bVar24 | _Var8;
        pcVar23 = pcVar23 + 1;
        uVar13 = uVar13 + 1;
        uVar14 = (uint)uVar19;
        uVar10 = uVar20;
      }
      else {
        uVar19 = 0;
        do {
          uVar18 = uVar19;
          uVar9 = uVar9 - uVar14;
          uVar14 = (uint)*(ushort *)(uVar12 * 0x5e8 + uVar16 * 0x38 + 0x295fa2 + uVar18 * 2);
          uVar19 = uVar18 + 1;
        } while ((int)uVar14 <= (int)uVar9);
        if (0x19 < uVar18) {
          __assert_fail("c_next <= E_WORD",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/randname.c"
                        ,0x85,
                        "size_t randname_make(randname_type, size_t, size_t, char *, size_t, const char ***)"
                       );
        }
        if (uVar19 != 0x1a) goto LAB_001caca4;
        if ((min <= uVar13 & bVar24) == 1) {
          *pcVar23 = '\0';
          return uVar13;
        }
        local_58 = local_58 + 1;
        uVar14 = uVar20;
      }
      uVar20 = uVar14;
      rVar7 = randname_make::cached_type;
    } while (uVar13 <= max && local_58 < 10);
  } while( true );
}

Assistant:

size_t randname_make(randname_type name_type, size_t min, size_t max,
					 char *word_buf, size_t buflen, const char ***sections)
{
	size_t lnum = 0;
	bool found_word = false;

	static name_probs lprobs;
	static randname_type cached_type = RANDNAME_NUM_TYPES;

	assert(name_type > 0 && name_type < RANDNAME_NUM_TYPES);

	/* To allow for a terminating character */
	assert(buflen > max);

	/* We cache one set of probabilities, only regenerate when
	   the type changes.  It's as good a way as any for now.
	   Frankly, we could probably regenerate every time. */
	if (cached_type != name_type) {
		const char **wordlist = NULL;

		wordlist = sections[name_type];

		(void)memset(lprobs, 0, sizeof(name_probs));
		build_prob(lprobs, wordlist);

		cached_type = name_type;
	}
        
	/* Generate the actual word wanted. */
	while (!found_word) {
		char *cp = word_buf;
		int c_prev = S_WORD;
		int c_cur = S_WORD;
		int tries = 0;
		bool contains_vowel = false;
		lnum = 0;

		/* We start the word again if we run out of space or have
		   had to have 10 goes to find a word that satisfies the
		   minimal conditions. */
		while (tries < 10 && lnum <= max && !found_word) {
			/* Pick the next letter based on a simple weighting
			  of which letters can follow the previous two */
			int r;
			int c_next = 0;

			assert(c_prev >= 0 && c_prev <= S_WORD);
			assert(c_cur >= 0 && c_cur <= S_WORD);

			r = randint0(lprobs[c_prev][c_cur][TOTAL]);

			while (r >= lprobs[c_prev][c_cur][c_next]) {
				r -= lprobs[c_prev][c_cur][c_next];
				c_next++;
			}

			assert(c_next <= E_WORD);
			assert(c_next >= 0);
            
			if (c_next == E_WORD) {
				/* If we've reached the end, we check if we've
				   met the simple conditions, otherwise have
				   another go at choosing a letter for this
				   position. */
				if (lnum >= min && contains_vowel) {
					*cp = '\0';
					found_word = true;
				} else {
					tries++;
				}
			} else {
				/* Add the letter to the word and move on. */
				*cp = I2A(c_next);

				if (is_a_vowel(*cp))
					contains_vowel = true;

				cp++;
				lnum++;
				assert(c_next <= S_WORD);
				assert(c_next >= 0);
				c_prev = c_cur;
				c_cur = c_next;
			}
		}
	}

	return lnum;
}